

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O0

ostream * libDAI::operator<<(ostream *os,Bucket *b)

{
  ostream *poVar1;
  ostream *poVar2;
  const_reference pvVar3;
  VarSet *pVVar4;
  vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_> *in_RSI;
  char *pcVar5;
  ostream *in_RDI;
  size_t bE_1;
  size_t bE;
  size_t count;
  VarSet *in_stack_ffffffffffffffd8;
  VarSet *pVVar6;
  VarSet *ns;
  ostream *os_00;
  long local_18;
  
  poVar1 = std::operator<<(in_RDI,"Bucket[var = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ulong)in_RSI[1].
                                    super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
  std::operator<<(poVar1,"; factors = {");
  local_18 = 0;
  poVar1 = (ostream *)0x0;
  while( true ) {
    os_00 = poVar1;
    poVar2 = (ostream *)
             std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
             size(in_RSI);
    if (poVar2 <= poVar1) break;
    pvVar3 = std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
             operator[](in_RSI,(size_type)os_00);
    if ((pvVar3->isFactor & 1U) != 0) {
      pcVar5 = "";
      if (local_18 != 0) {
        pcVar5 = ",";
      }
      std::operator<<(in_RDI,pcVar5);
      std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::operator[]
                (in_RSI,(size_type)os_00);
      operator<<(os_00,in_stack_ffffffffffffffd8);
      local_18 = local_18 + 1;
    }
    poVar1 = os_00 + 1;
  }
  std::operator<<(in_RDI,"}; messages = {");
  local_18 = 0;
  pVVar6 = (VarSet *)0x0;
  while( true ) {
    ns = pVVar6;
    pVVar4 = (VarSet *)
             std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
             size(in_RSI);
    if (pVVar4 <= pVVar6) break;
    pvVar3 = std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
             operator[](in_RSI,(size_type)ns);
    if ((pvVar3->isFactor & 1U) == 0) {
      pcVar5 = "";
      if (local_18 != 0) {
        pcVar5 = ",";
      }
      std::operator<<(in_RDI,pcVar5);
      std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::operator[]
                (in_RSI,(size_type)ns);
      operator<<(os_00,ns);
      local_18 = local_18 + 1;
    }
    pVVar6 = (VarSet *)
             ((long)&(ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::operator<<(in_RDI,"}]");
  return in_RDI;
}

Assistant:

std::ostream & operator << ( std::ostream & os, const Bucket & b ) {
                        os << "Bucket[var = " << b.var << "; factors = {";
                        size_t count = 0;
                        for( size_t bE = 0; bE < b.size(); bE++ )
                            if( b[bE].isFactor )
                                os << ((count++) ? "," : "") << b[bE];
                        os << "}; messages = {";
                        count = 0;
                        for( size_t bE = 0; bE < b.size(); bE++ )
                            if( !b[bE].isFactor )
                                os << ((count++) ? "," : "") << b[bE];
                        os << "}]";

                        return(os);
                    }